

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefParamAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefParamAssignmentSyntax,slang::syntax::NameSyntax&,slang::syntax::EqualsValueClauseSyntax&>
          (BumpAllocator *this,NameSyntax *args,EqualsValueClauseSyntax *args_1)

{
  DefParamAssignmentSyntax *pDVar1;
  size_t in_RDX;
  EqualsValueClauseSyntax *in_RSI;
  BumpAllocator *in_RDI;
  DefParamAssignmentSyntax *unaff_retaddr;
  
  pDVar1 = (DefParamAssignmentSyntax *)allocate(in_RDI,(size_t)in_RSI,in_RDX);
  slang::syntax::DefParamAssignmentSyntax::DefParamAssignmentSyntax
            (unaff_retaddr,(NameSyntax *)in_RDI,in_RSI);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }